

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O3

err_t cvrPrint(int argc,char **argv)

{
  err_t eVar1;
  int iVar2;
  cmd_sig_t *sig;
  size_t size;
  size_t ring_len;
  size_t count;
  size_t sig_len;
  ulong local_38;
  uint local_30;
  undefined4 uStack_2c;
  size_t local_28;
  
  if (argc != 1) {
    if (argc != 2) {
      return 0x25b;
    }
    iVar2 = strCmp(*argv,"-certc");
    if (iVar2 != 0) {
      return 0x25b;
    }
    argv = argv + 1;
  }
  eVar1 = cmdFileValExist(1,argv);
  if ((eVar1 == 0) && (eVar1 = cmdFileReadAll((void *)0x0,&local_38,*argv), eVar1 == 0)) {
    size = 0x630;
    if (0x630 < local_38) {
      size = local_38;
    }
    sig = (cmd_sig_t *)blobCreate(size);
    if (sig == (cmd_sig_t *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      eVar1 = cmdSigRead(sig,&local_28,*argv);
      if (((eVar1 == 0) && (eVar1 = cmdFileReadAll(sig,&local_38,*argv), eVar1 == 0)) &&
         (eVar1 = cmdCVCsCount((size_t *)&local_30,(octet *)sig,local_38 - local_28), eVar1 == 0)) {
        if (argc == 1) {
          eVar1 = 0;
          printf("certc: %u\n",(ulong)local_30);
          if (CONCAT44(uStack_2c,local_30) != 0) {
            puts("certs:");
            eVar1 = cmdCVCsPrint((octet *)sig,local_38 - local_28);
          }
        }
        else {
          eVar1 = 0;
          printf("%u\n",(ulong)local_30);
        }
      }
      blobClose(sig);
    }
  }
  return eVar1;
}

Assistant:

static err_t cvrPrint(int argc, char* argv[])
{
	err_t code;
	const char* scope;
	void* stack;
	size_t sig_len;
	cmd_sig_t* sig;
	size_t ring_len;
	octet* certs;
	size_t count;
	// обработать опции
	if (argc == 1)
		scope = 0;
	else if (argc == 2 && strEq(argv[0], "-certc"))
		scope = argv[0], ++scope, ++argv, --argc;
	else
		return ERR_CMD_PARAMS;
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// определить длину кольца
	code = cmdFileReadAll(0, &ring_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, MAX2(sizeof(cmd_sig_t), ring_len));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	certs = (octet*)stack;
	// определить длину подписи
	code = cmdSigRead(sig, &sig_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// прочитать кольцо
	code = cmdFileReadAll(certs, &ring_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить число сертификатов
	ASSERT(sig_len <= ring_len);
	code = cmdCVCsCount(&count, certs, ring_len - sig_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// печатать 
	if (!scope)
	{
		printf("certc: %u\n", (unsigned)count);
		if (count)
		{
			printf("certs:\n");
			code = cmdCVCsPrint(certs, ring_len - sig_len);
		}
	}
	else 
		printf("%u\n", (unsigned)count);
	// завершить
	cmdBlobClose(stack);
	return code;
}